

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::startDocument(QXmlStreamReaderPrivate *this)

{
  QByteArrayView ba;
  QAnyStringView name;
  QStringView encName;
  bool bVar1;
  qsizetype qVar2;
  const_pointer pvVar3;
  long in_RDI;
  long in_FS_OFFSET;
  Attribute *attrib;
  qsizetype i;
  qsizetype n;
  QByteArray enc;
  XmlStringRef value;
  XmlStringRef key;
  XmlStringRef prefix;
  QString err;
  undefined4 in_stack_fffffffffffffb58;
  Flag in_stack_fffffffffffffb5c;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  undefined4 in_stack_fffffffffffffb68;
  CaseSensitivity in_stack_fffffffffffffb6c;
  Value *symbol;
  QXmlStreamReaderPrivate *in_stack_fffffffffffffb70;
  undefined1 *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  undefined6 in_stack_fffffffffffffb88;
  QChar in_stack_fffffffffffffb8e;
  QString *in_stack_fffffffffffffb90;
  undefined6 in_stack_fffffffffffffb98;
  undefined1 in_stack_fffffffffffffb9e;
  undefined1 in_stack_fffffffffffffb9f;
  undefined1 *in_stack_fffffffffffffbc8;
  bool local_412;
  long local_3b8;
  QChar local_32c;
  QChar local_32a [49];
  QLatin1StringView local_2c8;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  QLatin1StringView local_288;
  undefined1 local_278 [86];
  QChar local_222 [29];
  char *local_1e8;
  undefined1 *local_1b8;
  undefined1 *puStack_1b0;
  undefined1 *local_1a8;
  QChar local_192 [25];
  undefined1 local_160 [40];
  QLatin1StringView local_138;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 *local_108;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  XmlStringRef local_d8 [3];
  QChar local_8a;
  QStringView local_88;
  QLatin1StringView local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x642122);
  std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x642165);
  QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64217a);
  QStringView::QStringView<QChar,_true>
            ((QStringView *)in_stack_fffffffffffffb70,
             (QChar *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
             CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  local_78 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                        CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = ::operator!=((QStringView *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  if (bVar1) {
    local_88 = QtPrivate::XmlStringRef::view
                         ((XmlStringRef *)
                          CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    QChar::QChar<char16_t,_true>(&local_8a,L' ');
    bVar1 = QStringView::contains
                      ((QStringView *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb8e,
                       in_stack_fffffffffffffb6c);
    if (bVar1) {
      QXmlStream::tr((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                     (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                     in_stack_fffffffffffffb5c);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                         (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      QString::~QString((QString *)0x642298);
    }
    else {
      QXmlStream::tr((char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                     (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                     in_stack_fffffffffffffb5c);
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                         (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      QString::~QString((QString *)0x6422f8);
    }
  }
  qVar2 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::size
                    ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)(in_RDI + 0x3e0));
  symbol = (Value *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68);
  local_3b8 = 0;
  while( true ) {
    bVar1 = QString::isNull((QString *)0x642341);
    if (!bVar1 || qVar2 <= local_3b8) break;
    QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::operator[]
              ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)(in_RDI + 0x3e0),
               local_3b8);
    local_d8[0].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8[0].m_string = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8[0].m_pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    symPrefix(in_stack_fffffffffffffb70,symbol);
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    symString((QXmlStreamReaderPrivate *)
              CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
              (Value *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    symString((QXmlStreamReaderPrivate *)
              CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
              (Value *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    bVar1 = QtPrivate::XmlStringRef::isEmpty(local_d8);
    local_412 = false;
    if (bVar1) {
      std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x642504);
      QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x642519);
      QStringView::QStringView<QChar,_true>
                ((QStringView *)in_stack_fffffffffffffb70,(QChar *)symbol,
                 CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      local_138 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)symbol,
                             CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      local_412 = ::operator==((QStringView *)
                               CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    }
    if (local_412 == false) {
      in_stack_fffffffffffffb9f = QtPrivate::XmlStringRef::isEmpty(local_d8);
      in_stack_fffffffffffffb9e = false;
      if ((bool)in_stack_fffffffffffffb9f) {
        in_stack_fffffffffffffb88 = SUB86(local_278,0);
        in_stack_fffffffffffffb8e.ucs = (char16_t)((ulong)local_278 >> 0x30);
        in_stack_fffffffffffffb90 =
             (QString *)std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x642ae2);
        QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x642af4);
        QStringView::QStringView<QChar,_true>
                  ((QStringView *)in_stack_fffffffffffffb70,(QChar *)symbol,
                   CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        local_288 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)symbol,
                               CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        in_stack_fffffffffffffb9e =
             ::operator==((QStringView *)
                          CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                          (QLatin1StringView *)
                          CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      }
      if ((bool)in_stack_fffffffffffffb9e == false) {
        QXmlStream::tr((char *)symbol,
                       (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                       in_stack_fffffffffffffb5c);
        QChar::QChar<char16_t,_true>(local_32a,L' ');
        QString::arg<QtPrivate::XmlStringRef,_true>
                  (in_stack_fffffffffffffb90,
                   (XmlStringRef *)CONCAT26(in_stack_fffffffffffffb8e.ucs,in_stack_fffffffffffffb88)
                   ,in_stack_fffffffffffffb84,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffffbc8 >> 0x30));
        QChar::QChar<char16_t,_true>(&local_32c,L' ');
        QString::arg<QtPrivate::XmlStringRef,_true>
                  (in_stack_fffffffffffffb90,
                   (XmlStringRef *)CONCAT26(in_stack_fffffffffffffb8e.ucs,in_stack_fffffffffffffb88)
                   ,in_stack_fffffffffffffb84,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffffbc8 >> 0x30));
        QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                           (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
        ;
        QString::~QString((QString *)0x642e06);
        QString::~QString((QString *)0x642e13);
        QString::~QString((QString *)0x642e20);
      }
      else {
        *(byte *)(in_RDI + 0x3a9) = *(byte *)(in_RDI + 0x3a9) | 0x20;
        in_stack_fffffffffffffb78 = local_298;
        pvVar3 = std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x642bac);
        in_stack_fffffffffffffb80 = SUB84(pvVar3,0);
        in_stack_fffffffffffffb84 = (int)((ulong)pvVar3 >> 0x20);
        QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x642bbe);
        QStringView::QStringView<QChar,_true>
                  ((QStringView *)in_stack_fffffffffffffb70,(QChar *)symbol,
                   CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        local_2b8._16_16_ =
             (undefined1  [16])
             Qt::Literals::StringLiterals::operator____L1
                       ((char *)symbol,CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60)
                       );
        bVar1 = ::operator==((QStringView *)
                             CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                             (QLatin1StringView *)
                             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        if (bVar1) {
          *(ushort *)(in_RDI + 0x3a8) = *(ushort *)(in_RDI + 0x3a8) & 0xfff7 | 8;
        }
        else {
          symbol = (Value *)local_2b8;
          in_stack_fffffffffffffb70 =
               (QXmlStreamReaderPrivate *)
               std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x642c77);
          QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x642c89);
          QStringView::QStringView<QChar,_true>
                    ((QStringView *)in_stack_fffffffffffffb70,(QChar *)symbol,
                     CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
          local_2c8 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)symbol,
                                 CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
          bVar1 = ::operator==((QStringView *)
                               CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          if (bVar1) {
            *(ushort *)(in_RDI + 0x3a8) = *(ushort *)(in_RDI + 0x3a8) & 0xfff7;
          }
          else {
            QXmlStream::tr((char *)symbol,
                           (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                           in_stack_fffffffffffffb5c);
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
            QString::~QString((QString *)0x642d46);
          }
        }
      }
    }
    else {
      *(undefined1 **)(in_RDI + 0x390) = local_118;
      *(undefined1 **)(in_RDI + 0x398) = puStack_110;
      *(undefined1 **)(in_RDI + 0x3a0) = local_108;
      if ((*(ushort *)(in_RDI + 0x3a8) >> 0xd & 1) != 0) {
        QXmlStream::tr((char *)symbol,
                       (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                       in_stack_fffffffffffffb5c);
        QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                           (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
        ;
        QString::~QString((QString *)0x642619);
      }
      in_stack_fffffffffffffbc8 = local_160;
      std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x642653);
      QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x642665);
      QStringView::QStringView<QChar,_true>
                ((QStringView *)in_stack_fffffffffffffb70,(QChar *)symbol,
                 CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      encName.m_data._0_6_ = in_stack_fffffffffffffb98;
      encName.m_size = (qsizetype)in_stack_fffffffffffffb90;
      encName.m_data._6_1_ = in_stack_fffffffffffffb9e;
      encName.m_data._7_1_ = in_stack_fffffffffffffb9f;
      bVar1 = QXmlUtils::isEncName(encName);
      if (bVar1) {
        local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivate::XmlStringRef::toString
                  ((XmlStringRef *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
        QString::toUtf8((QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
        QString::~QString((QString *)0x6427c3);
        if ((*(ushort *)(in_RDI + 0x3a8) >> 0xb & 1) == 0) {
          local_1e8 = QByteArray::constData((QByteArray *)0x6427f3);
          QAnyStringView::QAnyStringView<const_char_*,_true>
                    ((QAnyStringView *)in_stack_fffffffffffffb70,(char **)symbol);
          QFlags<QStringConverterBase::Flag>::QFlags
                    ((QFlags<QStringConverterBase::Flag> *)
                     CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                     in_stack_fffffffffffffb5c);
          name.field_0._4_4_ = in_stack_fffffffffffffb84;
          name.field_0._0_4_ = in_stack_fffffffffffffb80;
          name.m_size._0_6_ = in_stack_fffffffffffffb88;
          name.m_size._6_2_ = in_stack_fffffffffffffb8e.ucs;
          QStringDecoder::QStringDecoder
                    ((QStringDecoder *)0x642843,name,
                     (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
                     SUB84((ulong)in_stack_fffffffffffffb78 >> 0x20,0));
          QStringDecoder::operator=
                    ((QStringDecoder *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60)
                     ,(QStringDecoder *)
                      CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
          QStringDecoder::~QStringDecoder((QStringDecoder *)0x64286e);
          bVar1 = QStringConverter::isValid((QStringConverter *)(in_RDI + 0x120));
          if (bVar1) {
            QByteArrayView::QByteArrayView<QByteArray,_true>
                      ((QByteArrayView *)in_stack_fffffffffffffb70,(QByteArray *)symbol);
            QByteArrayView::first
                      ((QByteArrayView *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),0x6429cf);
            ba.m_size._7_1_ = in_stack_fffffffffffffb67;
            ba.m_size._0_7_ = in_stack_fffffffffffffb60;
            ba.m_data._0_4_ = (int)symbol;
            ba.m_data._4_4_ = (int)((ulong)symbol >> 0x20);
            QStringDecoder::operator()
                      ((QStringDecoder *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),ba);
            QStringDecoder::EncodedData::operator_cast_to_QString
                      ((EncodedData<QByteArrayView> *)
                       CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
            QString::~QString((QString *)0x642a59);
          }
          else {
            QXmlStream::tr((char *)symbol,
                           (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                           in_stack_fffffffffffffb5c);
            QChar::QChar<char16_t,_true>(local_222,L' ');
            QString::arg<QtPrivate::XmlStringRef,_true>
                      (in_stack_fffffffffffffb90,
                       (XmlStringRef *)
                       CONCAT26(in_stack_fffffffffffffb8e.ucs,in_stack_fffffffffffffb88),
                       in_stack_fffffffffffffb84,
                       (QChar)(char16_t)((ulong)in_stack_fffffffffffffbc8 >> 0x30));
            QString::operator=((QString *)
                               CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
            QString::~QString((QString *)0x642907);
            QString::~QString((QString *)0x642914);
          }
        }
        QByteArray::~QByteArray((QByteArray *)0x642a68);
      }
      else {
        QXmlStream::tr((char *)symbol,
                       (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                       in_stack_fffffffffffffb5c);
        QChar::QChar<char16_t,_true>(local_192,L' ');
        QString::arg<QtPrivate::XmlStringRef,_true>
                  (in_stack_fffffffffffffb90,
                   (XmlStringRef *)CONCAT26(in_stack_fffffffffffffb8e.ucs,in_stack_fffffffffffffb88)
                   ,in_stack_fffffffffffffb84,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffffbc8 >> 0x30));
        QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                           (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58))
        ;
        QString::~QString((QString *)0x64272b);
        QString::~QString((QString *)0x642738);
      }
    }
    local_3b8 = local_3b8 + 1;
  }
  bVar1 = QString::isNull((QString *)0x642e9d);
  if (!bVar1) {
    raiseWellFormedError
              ((QXmlStreamReaderPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffb60),
               (QString *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  }
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::clear
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)(in_RDI + 0x3e0));
  QString::~QString((QString *)0x642ee9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::startDocument()
{
    QString err;
    if (documentVersion != "1.0"_L1) {
        if (documentVersion.view().contains(u' '))
            err = QXmlStream::tr("Invalid XML version string.");
        else
            err = QXmlStream::tr("Unsupported XML version.");
    }
    qsizetype n = attributeStack.size();

    /* We use this bool to ensure that the pesudo attributes are in the
     * proper order:
     *
     * [23]     XMLDecl     ::=     '<?xml' VersionInfo EncodingDecl? SDDecl? S? '?>' */

    for (qsizetype i = 0; err.isNull() && i < n; ++i) {
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef key(symString(attrib.key));
        XmlStringRef value(symString(attrib.value));

        if (prefix.isEmpty() && key == "encoding"_L1) {
            documentEncoding = value;

            if (hasStandalone)
                err = QXmlStream::tr("The standalone pseudo attribute must appear after the encoding.");
            if (!QXmlUtils::isEncName(value))
                err = QXmlStream::tr("%1 is an invalid encoding name.").arg(value);
            else {
                QByteArray enc = value.toString().toUtf8();
                if (!lockEncoding) {
                    decoder = QStringDecoder(enc.constData());
                    if (!decoder.isValid()) {
                        err = QXmlStream::tr("Encoding %1 is unsupported").arg(value);
                    } else {
                        readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));
                    }
                }
            }
        } else if (prefix.isEmpty() && key == "standalone"_L1) {
            hasStandalone = true;
            if (value == "yes"_L1)
                standalone = true;
            else if (value == "no"_L1)
                standalone = false;
            else
                err = QXmlStream::tr("Standalone accepts only yes or no.");
        } else {
            err = QXmlStream::tr("Invalid attribute in XML declaration: %1 = %2").arg(key).arg(value);
        }
    }

    if (!err.isNull())
        raiseWellFormedError(err);
    attributeStack.clear();
}